

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O2

ostream_base * pstore::repo::operator<<(ostream_base *os,visibility v)

{
  ostream_base *poVar1;
  size_t in_RCX;
  void *in_RDX;
  
  if (v < (protected_vis|hidden_vis)) {
    poVar1 = (ostream_base *)
             exchange::export_ns::ostream_base::write
                       (os,*(int *)(&DAT_001249b4 + (ulong)v * 4) + 0x1249b4,in_RDX,0x1249b4);
    return poVar1;
  }
  poVar1 = (ostream_base *)exchange::export_ns::ostream_base::write(os,0x124806,in_RDX,in_RCX);
  return poVar1;
}

Assistant:

ostream_base & operator<< (ostream_base & os, visibility const v) {
            switch (v) {
            case repo::visibility::default_vis: return os << "default";
            case repo::visibility::hidden_vis: return os << "hidden";
            case repo::visibility::protected_vis: return os << "protected";
            }
            return os << "unknown";
        }